

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void * rw::imageClose(void *object,int32 offset,int32 size)

{
  undefined8 *puVar1;
  int local_24;
  int i;
  ImageGlobals *g;
  int32 size_local;
  int32 offset_local;
  void *object_local;
  
  puVar1 = (undefined8 *)(engine + imageModuleOffset);
  (*DAT_001660a8)(*puVar1);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 1) = 0;
  for (local_24 = 0; local_24 < *(int *)(puVar1 + 0x20); local_24 = local_24 + 1) {
    (*DAT_001660a8)(puVar1[(long)local_24 * 3 + 2]);
  }
  *(undefined4 *)(puVar1 + 0x20) = 0;
  return object;
}

Assistant:

static void*
imageClose(void *object, int32 offset, int32 size)
{
	ImageGlobals *g = PLUGINOFFSET(ImageGlobals, engine, imageModuleOffset);
	int i;
	rwFree(g->searchPaths);
	g->searchPaths = nil;
	g->numSearchPaths = 0;
	for(i = 0; i < g->numFileFormats; i++)
		rwFree(g->fileFormats[i].extension);
	g->numFileFormats = 0;
	return object;
}